

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::StartMouseMovingWindowOrNode
               (ImGuiWindow *window,ImGuiDockNode *node,bool undock_floating_node)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  byte bVar6;
  ImGuiContext *pIVar7;
  ImGuiDockNode *pIVar8;
  ImGuiContext *g;
  bool bVar9;
  ImGuiDockNode *pIVar10;
  uint uVar11;
  ImVec2 IVar12;
  float fVar13;
  
  pIVar7 = GImGui;
  bVar6 = 1;
  if (((node != (ImGuiDockNode *)0x0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (pIVar8 = node, (node->VisibleWindow->Flags & 4) == 0)) {
    do {
      pIVar10 = pIVar8;
      pIVar8 = pIVar10->ParentNode;
    } while (pIVar10->ParentNode != (ImGuiDockNode *)0x0);
    if (((pIVar10->OnlyNodeWithWindows != node) || (pIVar10->CentralNode != (ImGuiDockNode *)0x0))
       && ((undock_floating_node || ((pIVar10->MergedFlags & 0x400) != 0)))) {
      bVar6 = 0;
    }
  }
  if ((GImGui->IO).MouseDown[0] == true) {
    fVar1 = (GImGui->IO).MouseDragThreshold;
    fVar13 = fVar1 * 1.7;
    uVar11 = -(uint)(fVar13 < 0.0);
    fVar1 = (float)(~uVar11 & (uint)fVar13 | (uint)fVar1 & uVar11);
    bVar5 = (GImGui->IO).MouseDragMaxDistanceSqr[0] < fVar1 * fVar1;
    bVar9 = !bVar5;
    if (!(bool)(bVar5 | bVar6)) {
      DockContextQueueUndockNode(GImGui,node);
      return;
    }
  }
  else {
    bVar9 = false;
  }
  if (((bool)(bVar6 & ((GImGui->IO).MouseDownDuration[0] == 0.0 | bVar9))) &&
     (GImGui->MovingWindow != window)) {
    FocusWindow(window);
    SetActiveID(window->MoveId,window);
    bVar9 = true;
    pIVar7->NavDisableHighlight = true;
    IVar2 = (pIVar7->IO).MouseClickedPos[0];
    IVar3 = window->RootWindowDockTree->Pos;
    IVar12.x = IVar2.x - IVar3.x;
    IVar12.y = IVar2.y - IVar3.y;
    pIVar7->ActiveIdClickOffset = IVar12;
    pIVar7->ActiveIdNoClearOnFocusLoss = true;
    SetActiveIdUsingNavAndKeys();
    if (((window->Flags & 4) != 0) || ((window->RootWindowDockTree->Flags & 4) != 0)) {
      bVar9 = false;
    }
    if ((window->DockNodeAsHost != (ImGuiDockNode *)0x0) &&
       (pIVar4 = window->DockNodeAsHost->VisibleWindow, pIVar4 != (ImGuiWindow *)0x0)) {
      bVar9 = (bool)((pIVar4->Flags & 4) == 0 & bVar9);
    }
    if (bVar9) {
      pIVar7->MovingWindow = window;
    }
    return;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindowOrNode(ImGuiWindow* window, ImGuiDockNode* node, bool undock_floating_node)
{
    ImGuiContext& g = *GImGui;
    bool can_undock_node = false;
    if (node != NULL && node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove) == 0)
    {
        // Can undock if:
        // - part of a floating node hierarchy with more than one visible node (if only one is visible, we'll just move the whole hierarchy)
        // - part of a dockspace node hierarchy (trivia: undocking from a fixed/central node will create a new node and copy windows)
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->OnlyNodeWithWindows != node || root_node->CentralNode != NULL)   // -V1051 PVS-Studio thinks node should be root_node and is wrong about that.
            if (undock_floating_node || root_node->IsDockSpace())
                can_undock_node = true;
    }

    const bool clicked = IsMouseClicked(0);
    const bool dragging = IsMouseDragging(0, g.IO.MouseDragThreshold * 1.70f);
    if (can_undock_node && dragging)
        DockContextQueueUndockNode(&g, node); // Will lead to DockNodeStartMouseMovingWindow() -> StartMouseMovingWindow() being called next frame
    else if (!can_undock_node && (clicked || dragging) && g.MovingWindow != window)
        StartMouseMovingWindow(window);
}